

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_boundary.cpp
# Opt level: O3

void test_word_container<wchar_t,__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
               (__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                begin,__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                      end,vector<int,_std::allocator<int>_> *ipos,
               vector<int,_std::allocator<int>_> *imasks,
               vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *ichunks,locale *l,boundary_type bt)

{
  undefined8 uVar1;
  undefined4 uVar2;
  pointer pbVar3;
  pointer pbVar4;
  wchar_t wVar5;
  int iVar6;
  pointer piVar7;
  ostream *poVar8;
  ulong uVar9;
  runtime_error *prVar10;
  ulong uVar11;
  int *__args;
  uint uVar12;
  ulong uVar13;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  _Var14;
  ulong uVar15;
  bool bVar16;
  bi_type bi;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  chunks;
  ti_type ti;
  vector<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  iters;
  vector<int,_std::allocator<int>_> masks;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bmasks;
  vector<int,_std::allocator<int>_> pos;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  fchunks;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> empty_chunk;
  undefined1 local_238 [16];
  mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  local_228;
  uint local_208;
  bool local_204;
  undefined1 local_1f8 [16];
  mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  local_1e8;
  uint local_1c8;
  bool local_1c4;
  undefined1 local_1c0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  rule_type local_1a0;
  undefined1 local_19c;
  uint local_194;
  undefined1 local_190 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_180;
  uint local_170;
  undefined1 local_16c;
  base_iterator local_168;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_160;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  local_158;
  string local_138;
  uint local_118;
  undefined1 local_114;
  wchar_t local_10c;
  void *local_108;
  iterator iStack_100;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *local_f8;
  locale *local_e8;
  vector<int,_std::allocator<int>_> *local_e0;
  void *local_d8;
  iterator iStack_d0;
  int *local_c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b8;
  void *local_98;
  iterator iStack_90;
  int *local_88;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *local_80;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  local_78;
  vector<int,_std::allocator<int>_> *local_60;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_58;
  ulong local_38;
  
  uVar15 = 3;
  local_168._M_current = end._M_current;
  local_160._M_current = begin._M_current;
  local_e8 = l;
  local_e0 = imasks;
  local_80 = ichunks;
  local_60 = ipos;
  if (bt == word) {
    uVar15 = 0x1f;
  }
  do {
    _Var14._M_current = (wchar_t *)&local_228;
    uVar12 = 0;
    if ((uVar15 & 1) != 0) {
      uVar12 = 0xf;
    }
    local_d8 = (void *)0x0;
    iStack_d0._M_current = (int *)0x0;
    local_c8 = (int *)0x0;
    local_88 = (int *)0x0;
    local_98 = (void *)0x0;
    iStack_90._M_current = (int *)0x0;
    local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
    local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (uint *)0x0;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = L'\0';
    local_158.
    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_158.
    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_158.
    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8 = (__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                *)0x0;
    local_108 = (void *)0x0;
    iStack_100._M_current =
         (__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
          *)0x0;
    std::
    vector<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>,std::allocator<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>>
    ::_M_realloc_insert<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>const&>
              ((vector<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>,std::allocator<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>>
                *)&local_108,(iterator)0x0,&local_160);
    local_1f8._0_8_ = local_1f8._0_8_ & 0xffffffff00000000;
    if (local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_b8,
                 (iterator)
                 local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)local_1f8);
    }
    else {
      *local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = 0;
      local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    iVar6 = (int)uVar15;
    local_194 = (iVar6 << 0x1b) >> 0x1f & 0xf0000U |
                (iVar6 << 0x1c) >> 0x1f & 0xf000U |
                (iVar6 << 0x1d) >> 0x1f & 0xf00U | (iVar6 << 0x1e) >> 0x1f & 0xf0U | uVar12;
    piVar7 = (imasks->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    local_38 = uVar15;
    if ((imasks->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish != piVar7) {
      uVar15 = 1;
      uVar9 = 0;
      do {
        uVar13 = uVar15;
        if ((local_194 & piVar7[uVar9]) == 0) {
          std::__cxx11::wstring::_M_append
                    ((wchar_t *)&local_58,
                     (ulong)(local_80->
                            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar9]._M_dataplus._M_p);
        }
        else {
          if (iStack_d0._M_current == local_c8) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_d8,iStack_d0,piVar7 + uVar9);
          }
          else {
            *iStack_d0._M_current = piVar7[uVar9];
            iStack_d0._M_current = iStack_d0._M_current + 1;
          }
          std::
          vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          ::push_back(&local_158,
                      (local_80->
                      super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar9);
          std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                          *)local_1f8,&local_58,
                         (local_80->
                         super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + uVar9);
          std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>::
          emplace_back<std::__cxx11::wstring>
                    ((vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>> *)
                     &local_78,
                     (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                     local_1f8);
          if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_1f8._0_8_ != &local_1e8) {
            operator_delete((void *)local_1f8._0_8_);
          }
          local_58._M_string_length = 0;
          *local_58._M_dataplus._M_p = L'\0';
          __args = (local_60->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start + uVar9;
          if (iStack_90._M_current == local_88) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_98,iStack_90,__args);
          }
          else {
            *iStack_90._M_current = *__args;
            iStack_90._M_current = iStack_90._M_current + 1;
          }
        }
        piVar7 = (local_e0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (((piVar7[uVar9] & local_194) != 0) ||
           (uVar11 = (long)(local_e0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)piVar7 >> 2,
           uVar11 - 1 == uVar9)) {
          local_1f8._0_8_ =
               local_160._M_current +
               (local_60->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar9];
          if (iStack_100._M_current == local_f8) {
            std::
            vector<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>,std::allocator<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>>
            ::_M_realloc_insert<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>const&>
                      ((vector<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>,std::allocator<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>>
                        *)&local_108,iStack_100,
                       (__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                        *)local_1f8);
          }
          else {
            (iStack_100._M_current)->_M_current = (wchar_t *)local_1f8._0_8_;
            iStack_100._M_current = iStack_100._M_current + 1;
          }
          piVar7 = (local_e0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          local_238._0_4_ = piVar7[uVar9];
          if (local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_b8,
                       (iterator)
                       local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)local_238);
            piVar7 = (local_e0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
          }
          else {
            *local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = piVar7[uVar9];
            local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          uVar11 = (long)(local_e0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar7 >> 2;
        }
        uVar15 = (ulong)((int)uVar13 + 1);
        uVar9 = uVar13;
      } while (uVar13 < uVar11);
    }
    booster::locale::boundary::details::
    mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::mapping((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_1c0,bt,(base_iterator)local_160._M_current,local_168,local_e8);
    local_1a0 = local_194;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (wchar_t *)0x0;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1e8.begin_._M_current = (wchar_t *)0x0;
    local_1e8.end_._M_current._0_5_ = 0;
    local_1e8.end_._M_current._5_3_ = 0;
    local_19c = 0;
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_228.begin_._M_current = (wchar_t *)0x0;
    local_228.end_._M_current._0_5_ =
         SUB85((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                *)local_1c0,0);
    local_228.end_._M_current._5_3_ = (undefined3)((ulong)local_1c0 >> 0x28);
    local_208 = local_194;
    local_204 = false;
    local_238._0_8_ = local_1b0._M_allocated_capacity;
    local_238._8_8_ = local_1b0._M_allocated_capacity;
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              ((ulong)local_228.index_.
                      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr & 0xffffffff00000000);
    booster::locale::boundary::details::
    segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::increment((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *)local_238);
    local_1f8._0_8_ = local_238._0_8_;
    local_1f8._8_8_ = local_238._8_8_;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ =
         local_228.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr._0_4_;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         local_228.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    local_1e8.begin_._M_current = local_228.begin_._M_current;
    local_1c8 = local_208;
    local_1c4 = local_204;
    local_1e8.end_._M_current._0_5_ = local_228.end_._M_current._0_5_;
    local_1e8.end_._M_current._5_3_ = local_228.end_._M_current._5_3_;
    if (((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          *)CONCAT35(local_228.end_._M_current._5_3_,local_228.end_._M_current._0_5_) !=
         (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          *)local_1c0) ||
       (uVar15 = 0,
       local_228.begin_._M_current !=
       (wchar_t *)
       ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_1c0 + 8))->_M_pi -
        *(long *)local_1c0 >> 4))) {
      uVar15 = 0;
      do {
        test_counter = test_counter + 1;
        local_238._0_8_ = _Var14._M_current;
        std::__cxx11::wstring::
        _M_construct<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
                  ((wstring *)local_238,local_1f8._0_8_,local_1f8._8_8_);
        uVar1 = local_238._0_8_;
        if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_238._8_8_ ==
            (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_158.
               super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_string_length) {
          if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_238._8_8_ ==
              (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)0x0) {
            bVar16 = true;
          }
          else {
            iVar6 = wmemcmp((wchar_t *)local_238._0_8_,
                            local_158.
                            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_dataplus._M_p,
                            local_238._8_8_);
            bVar16 = iVar6 == 0;
          }
        }
        else {
          bVar16 = false;
        }
        if ((wchar_t *)uVar1 != _Var14._M_current) {
          operator_delete((void *)uVar1);
        }
        if (!bVar16) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x67);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," p->str()==chunks[i]",0x14);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar16 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar16) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_238._0_8_ = _Var14._M_current;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_238,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar10,(string *)local_238);
            __cxa_throw(prVar10,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if (local_1e8.index_.
            super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr._0_4_ != *(wchar_t *)((long)local_d8 + uVar15 * 4)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x68);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8," p->rule() == unsigned(masks[i])",0x20);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar16 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar16) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_238._0_8_ = _Var14._M_current;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_238,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar10,(string *)local_238);
            __cxa_throw(prVar10,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        booster::locale::boundary::details::
        segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::increment((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     *)local_1f8);
        uVar15 = (ulong)((int)uVar15 + 1);
      } while (((undefined1 *)
                CONCAT35(local_1e8.end_._M_current._5_3_,local_1e8.end_._M_current._0_5_) !=
                local_1c0) ||
              (local_1e8.begin_._M_current !=
               (wchar_t *)
               ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_1c0 + 8))->_M_pi -
                *(long *)local_1c0 >> 4)));
    }
    test_counter = test_counter + 1;
    if ((long)local_158.
              super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_158.
              super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 5 != uVar15) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x6b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," chunks.size() == i",0x13);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      iVar6 = error_counter + 1;
      bVar16 = 100000 < error_counter;
      error_counter = iVar6;
      if (bVar16) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_238._0_8_ = _Var14._M_current;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_238,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar10,(string *)local_238);
        __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    while( true ) {
      uVar12 = (int)uVar15 - 1;
      uVar15 = (ulong)uVar12;
      local_228.index_.
      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_228.begin_._M_current = (wchar_t *)0x0;
      local_228.end_._M_current._0_5_ = SUB85(local_1c0,0);
      local_228.end_._M_current._5_3_ = (undefined3)((ulong)local_1c0 >> 0x28);
      local_208 = local_1a0;
      local_204 = (bool)local_19c;
      local_238._0_8_ = local_1b0._M_allocated_capacity;
      local_238._8_8_ = local_1b0._M_allocated_capacity;
      local_228.index_.
      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)
                ((ulong)local_228.index_.
                        super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr & 0xffffffff00000000);
      booster::locale::boundary::details::
      segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::increment((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)local_238);
      if ((CONCAT35(local_1e8.end_._M_current._5_3_,local_1e8.end_._M_current._0_5_) ==
           CONCAT35(local_228.end_._M_current._5_3_,local_228.end_._M_current._0_5_)) &&
         (local_1e8.begin_._M_current == local_228.begin_._M_current)) break;
      booster::locale::boundary::details::
      segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::decrement((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)local_1f8);
      test_counter = test_counter + 1;
      local_238._0_8_ = _Var14._M_current;
      std::__cxx11::wstring::
      _M_construct<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
                ((wstring *)local_238,local_1f8._0_8_,local_1f8._8_8_);
      uVar1 = local_238._0_8_;
      if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           *)local_238._8_8_ ==
          (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           *)local_158.
             super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_string_length) {
        if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_238._8_8_ ==
            (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)0x0) {
          bVar16 = true;
        }
        else {
          iVar6 = wmemcmp((wchar_t *)local_238._0_8_,
                          local_158.
                          super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_dataplus._M_p,
                          local_238._8_8_);
          bVar16 = iVar6 == 0;
        }
      }
      else {
        bVar16 = false;
      }
      if ((wchar_t *)uVar1 != _Var14._M_current) {
        operator_delete((void *)uVar1);
      }
      if (!bVar16) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error in line:",0xe);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x73);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," p->str()==chunks[--i]",0x16);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        iVar6 = error_counter + 1;
        bVar16 = 100000 < error_counter;
        error_counter = iVar6;
        if (bVar16) goto LAB_001213db;
      }
      test_counter = test_counter + 1;
      if (local_1e8.index_.
          super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr._0_4_ != *(wchar_t *)((long)local_d8 + uVar15 * 4)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error in line:",0xe);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x74);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8," p->rule() == unsigned(masks[i])",0x20);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        iVar6 = error_counter + 1;
        bVar16 = 100000 < error_counter;
        error_counter = iVar6;
        if (bVar16) {
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
          local_238._0_8_ = _Var14._M_current;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_238,"Error limits reached, stopping unit test","");
          booster::runtime_error::runtime_error(prVar10,(string *)local_238);
          __cxa_throw(prVar10,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
    }
    test_counter = test_counter + 1;
    if (uVar12 != 0xffffffff) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x6e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," i==0",5);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      iVar6 = error_counter + 1;
      bVar16 = 100000 < error_counter;
      error_counter = iVar6;
      if (bVar16) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_238._0_8_ = _Var14._M_current;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_238,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar10,(string *)local_238);
        __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    local_1e8.begin_._M_current =
         (wchar_t *)
         ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_1c0 + 8))->_M_pi -
          *(long *)local_1c0 >> 4);
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_1e8.begin_._M_current - 1);
    local_1f8._0_8_ = local_1b0._8_8_;
    local_1f8._8_8_ = local_1b0._8_8_;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ = L'\0';
    local_1e8.end_._M_current._0_5_ = SUB85(local_1c0,0);
    local_1e8.end_._M_current._5_3_ = (undefined3)((ulong)local_1c0 >> 0x28);
    local_1c8 = local_1a0;
    local_1c4 = (bool)local_19c;
    if (local_158.
        super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_158.
        super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar15 = 0;
      uVar9 = 1;
      do {
        booster::locale::boundary::details::
        segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::decrement((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     *)local_1f8);
        pbVar4 = local_158.
                 super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar3 = local_158.
                 super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        test_counter = test_counter + 1;
        local_238._0_8_ = _Var14._M_current;
        std::__cxx11::wstring::
        _M_construct<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
                  ((wstring *)local_238,local_1f8._0_8_,local_1f8._8_8_);
        uVar1 = local_238._0_8_;
        uVar15 = (ulong)((int)((ulong)((long)pbVar4 - (long)pbVar3) >> 5) + ~(uint)uVar15);
        if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_238._8_8_ ==
            (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_158.
               super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_string_length) {
          if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_238._8_8_ ==
              (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)0x0) {
            bVar16 = true;
          }
          else {
            iVar6 = wmemcmp((wchar_t *)local_238._0_8_,
                            local_158.
                            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_dataplus._M_p,
                            local_238._8_8_);
            bVar16 = iVar6 == 0;
          }
        }
        else {
          bVar16 = false;
        }
        if ((wchar_t *)uVar1 != _Var14._M_current) {
          operator_delete((void *)uVar1);
        }
        if (!bVar16) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x7a);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," p->str()==chunks[index]",0x18)
          ;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar16 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar16) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_238._0_8_ = _Var14._M_current;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_238,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar10,(string *)local_238);
            __cxa_throw(prVar10,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if (local_1e8.index_.
            super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr._0_4_ != *(wchar_t *)((long)local_d8 + uVar15 * 4)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x7b);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8," p->rule() == unsigned(masks[index])",0x24);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar16 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar16) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_238._0_8_ = _Var14._M_current;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_238,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar10,(string *)local_238);
            __cxa_throw(prVar10,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        bVar16 = uVar9 < (ulong)((long)local_158.
                                       super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_158.
                                       super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5);
        uVar15 = uVar9;
        uVar9 = (ulong)((int)uVar9 + 1);
      } while (bVar16);
    }
    test_counter = test_counter + 1;
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_228.begin_._M_current = (wchar_t *)0x0;
    local_228.end_._M_current._0_5_ = SUB85(local_1c0,0);
    local_228.end_._M_current._5_3_ = (undefined3)((ulong)local_1c0 >> 0x28);
    local_208 = local_1a0;
    local_204 = (bool)local_19c;
    local_238._0_8_ = local_1b0._M_allocated_capacity;
    local_238._8_8_ = local_1b0._M_allocated_capacity;
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              ((ulong)local_228.index_.
                      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr & 0xffffffff00000000);
    booster::locale::boundary::details::
    segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::increment((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *)local_238);
    if ((CONCAT35(local_1e8.end_._M_current._5_3_,local_1e8.end_._M_current._0_5_) !=
         CONCAT35(local_228.end_._M_current._5_3_,local_228.end_._M_current._0_5_)) ||
       (local_1e8.begin_._M_current != local_228.begin_._M_current)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x7d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," p==map.begin()",0xf);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      iVar6 = error_counter + 1;
      bVar16 = 100000 < error_counter;
      error_counter = iVar6;
      if (bVar16) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_238._0_8_ = _Var14._M_current;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_238,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar10,(string *)local_238);
        __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (wchar_t *)0x0;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1e8.begin_._M_current = (wchar_t *)0x0;
    local_1e8.end_._M_current._0_5_ = 0;
    local_1e8.end_._M_current._5_3_ = 0;
    local_19c = 1;
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_228.begin_._M_current = (wchar_t *)0x0;
    local_228.end_._M_current._0_5_ = SUB85(local_1c0,0);
    local_228.end_._M_current._5_3_ = (undefined3)((ulong)local_1c0 >> 0x28);
    local_208 = local_1a0;
    local_204 = true;
    local_238._0_8_ = local_1b0._M_allocated_capacity;
    local_238._8_8_ = local_1b0._M_allocated_capacity;
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              ((ulong)local_228.index_.
                      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr & 0xffffffff00000000);
    booster::locale::boundary::details::
    segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::increment((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *)local_238);
    local_1f8._0_8_ = local_238._0_8_;
    local_1f8._8_8_ = local_238._8_8_;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ =
         local_228.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr._0_4_;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         local_228.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    local_1e8.begin_._M_current = local_228.begin_._M_current;
    local_1c8 = local_208;
    local_1c4 = local_204;
    local_1e8.end_._M_current._0_5_ = local_228.end_._M_current._0_5_;
    local_1e8.end_._M_current._5_3_ = local_228.end_._M_current._5_3_;
    if (((undefined1 *)CONCAT35(local_228.end_._M_current._5_3_,local_228.end_._M_current._0_5_) !=
         local_1c0) ||
       (uVar15 = 0,
       local_228.begin_._M_current !=
       (wchar_t *)
       ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_1c0 + 8))->_M_pi -
        *(long *)local_1c0 >> 4))) {
      uVar15 = 0;
      do {
        test_counter = test_counter + 1;
        local_238._0_8_ = _Var14._M_current;
        std::__cxx11::wstring::
        _M_construct<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
                  ((wstring *)local_238,local_1f8._0_8_,local_1f8._8_8_);
        uVar1 = local_238._0_8_;
        if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_238._8_8_ ==
            (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_78.
               super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_string_length) {
          if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_238._8_8_ ==
              (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)0x0) {
            bVar16 = true;
          }
          else {
            iVar6 = wmemcmp((wchar_t *)local_238._0_8_,
                            local_78.
                            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_dataplus._M_p,
                            local_238._8_8_);
            bVar16 = iVar6 == 0;
          }
        }
        else {
          bVar16 = false;
        }
        if ((wchar_t *)uVar1 != _Var14._M_current) {
          operator_delete((void *)uVar1);
        }
        if (!bVar16) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x85);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," p->str()==fchunks[i]",0x15);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar16 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar16) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_238._0_8_ = _Var14._M_current;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_238,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar10,(string *)local_238);
            __cxa_throw(prVar10,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if (local_1e8.index_.
            super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr._0_4_ != *(wchar_t *)((long)local_d8 + uVar15 * 4)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x86);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8," p->rule() == unsigned(masks[i])",0x20);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar16 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar16) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_238._0_8_ = _Var14._M_current;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_238,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar10,(string *)local_238);
            __cxa_throw(prVar10,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        booster::locale::boundary::details::
        segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::increment((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     *)local_1f8);
        uVar15 = (ulong)((int)uVar15 + 1);
      } while (((undefined1 *)
                CONCAT35(local_1e8.end_._M_current._5_3_,local_1e8.end_._M_current._0_5_) !=
                local_1c0) ||
              (local_1e8.begin_._M_current !=
               (wchar_t *)
               ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_1c0 + 8))->_M_pi -
                *(long *)local_1c0 >> 4)));
    }
    test_counter = test_counter + 1;
    if ((long)local_158.
              super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_158.
              super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 5 != uVar15) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x89);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," chunks.size() == i",0x13);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      iVar6 = error_counter + 1;
      bVar16 = 100000 < error_counter;
      error_counter = iVar6;
      if (bVar16) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_238._0_8_ = _Var14._M_current;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_238,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar10,(string *)local_238);
        __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    while( true ) {
      uVar12 = (int)uVar15 - 1;
      uVar15 = (ulong)uVar12;
      local_228.index_.
      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_228.begin_._M_current = (wchar_t *)0x0;
      local_228.end_._M_current._0_5_ = SUB85(local_1c0,0);
      local_228.end_._M_current._5_3_ = (undefined3)((ulong)local_1c0 >> 0x28);
      local_208 = local_1a0;
      local_204 = (bool)local_19c;
      local_238._0_8_ = local_1b0._M_allocated_capacity;
      local_238._8_8_ = local_1b0._M_allocated_capacity;
      local_228.index_.
      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)
                ((ulong)local_228.index_.
                        super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr & 0xffffffff00000000);
      booster::locale::boundary::details::
      segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::increment((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)local_238);
      if ((CONCAT35(local_1e8.end_._M_current._5_3_,local_1e8.end_._M_current._0_5_) ==
           CONCAT35(local_228.end_._M_current._5_3_,local_228.end_._M_current._0_5_)) &&
         (local_1e8.begin_._M_current == local_228.begin_._M_current)) break;
      booster::locale::boundary::details::
      segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::decrement((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)local_1f8);
      local_238._0_8_ = _Var14._M_current;
      std::__cxx11::wstring::
      _M_construct<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
                ((wstring *)local_238,local_1f8._0_8_,local_1f8._8_8_);
      uVar1 = local_238._0_8_;
      if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           *)local_238._8_8_ ==
          (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           *)local_78.
             super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_string_length) {
        if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_238._8_8_ ==
            (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)0x0) {
          bVar16 = false;
        }
        else {
          iVar6 = wmemcmp((wchar_t *)local_238._0_8_,
                          local_78.
                          super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_dataplus._M_p,
                          local_238._8_8_);
          bVar16 = iVar6 != 0;
        }
      }
      else {
        bVar16 = true;
      }
      if ((wchar_t *)uVar1 != _Var14._M_current) {
        operator_delete((void *)uVar1);
      }
      if ((bVar16) &&
         (local_238._0_8_ = _Var14._M_current,
         std::__cxx11::wstring::
         _M_construct<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
                   ((wstring *)local_238,local_1f8._0_8_,local_1f8._8_8_),
         (wchar_t *)local_238._0_8_ != _Var14._M_current)) {
        operator_delete((void *)local_238._0_8_);
      }
      test_counter = test_counter + 1;
      local_238._0_8_ = _Var14._M_current;
      std::__cxx11::wstring::
      _M_construct<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
                ((wstring *)local_238,local_1f8._0_8_,local_1f8._8_8_);
      uVar1 = local_238._0_8_;
      if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           *)local_238._8_8_ ==
          (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           *)local_78.
             super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_string_length) {
        if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_238._8_8_ ==
            (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)0x0) {
          bVar16 = true;
        }
        else {
          iVar6 = wmemcmp((wchar_t *)local_238._0_8_,
                          local_78.
                          super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_dataplus._M_p,
                          local_238._8_8_);
          bVar16 = iVar6 == 0;
        }
      }
      else {
        bVar16 = false;
      }
      if ((wchar_t *)uVar1 != _Var14._M_current) {
        operator_delete((void *)uVar1);
      }
      if (!bVar16) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error in line:",0xe);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x96);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," p->str()==fchunks[--i]",0x17);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        iVar6 = error_counter + 1;
        bVar16 = 100000 < error_counter;
        error_counter = iVar6;
        if (bVar16) {
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
          local_238._0_8_ = _Var14._M_current;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_238,"Error limits reached, stopping unit test","");
          booster::runtime_error::runtime_error(prVar10,(string *)local_238);
          __cxa_throw(prVar10,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      if (local_1e8.index_.
          super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr._0_4_ != *(wchar_t *)((long)local_d8 + uVar15 * 4)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error in line:",0xe);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x97);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8," p->rule() == unsigned(masks[i])",0x20);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        iVar6 = error_counter + 1;
        bVar16 = 100000 < error_counter;
        error_counter = iVar6;
        if (bVar16) {
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
          local_238._0_8_ = _Var14._M_current;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_238,"Error limits reached, stopping unit test","");
          booster::runtime_error::runtime_error(prVar10,(string *)local_238);
          __cxa_throw(prVar10,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
    }
    test_counter = test_counter + 1;
    if (uVar12 != 0xffffffff) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x8d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," i==0",5);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      iVar6 = error_counter + 1;
      bVar16 = 100000 < error_counter;
      error_counter = iVar6;
      if (bVar16) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_238._0_8_ = _Var14._M_current;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_238,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar10,(string *)local_238);
        __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    local_1e8.begin_._M_current =
         (wchar_t *)
         ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_1c0 + 8))->_M_pi -
          *(long *)local_1c0 >> 4);
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_1e8.begin_._M_current - 1);
    local_1f8._0_8_ = local_1b0._8_8_;
    local_1f8._8_8_ = local_1b0._8_8_;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ = L'\0';
    local_1e8.end_._M_current._0_5_ = SUB85(local_1c0,0);
    local_1e8.end_._M_current._5_3_ = (undefined3)((ulong)local_1c0 >> 0x28);
    local_1c8 = local_1a0;
    local_1c4 = (bool)local_19c;
    if (local_158.
        super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_158.
        super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar15 = 0;
      uVar9 = 1;
      do {
        booster::locale::boundary::details::
        segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::decrement((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     *)local_1f8);
        pbVar4 = local_158.
                 super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar3 = local_158.
                 super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        test_counter = test_counter + 1;
        local_238._0_8_ = _Var14._M_current;
        std::__cxx11::wstring::
        _M_construct<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
                  ((wstring *)local_238,local_1f8._0_8_,local_1f8._8_8_);
        uVar1 = local_238._0_8_;
        uVar15 = (ulong)((int)((ulong)((long)pbVar4 - (long)pbVar3) >> 5) + ~(uint)uVar15);
        if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_238._8_8_ ==
            (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_78.
               super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_string_length) {
          if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_238._8_8_ ==
              (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)0x0) {
            bVar16 = true;
          }
          else {
            iVar6 = wmemcmp((wchar_t *)local_238._0_8_,
                            local_78.
                            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_dataplus._M_p,
                            local_238._8_8_);
            bVar16 = iVar6 == 0;
          }
        }
        else {
          bVar16 = false;
        }
        if ((wchar_t *)uVar1 != _Var14._M_current) {
          operator_delete((void *)uVar1);
        }
        if (!bVar16) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x9e);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8," p->str()==fchunks[index]",0x19);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar16 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar16) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_238._0_8_ = _Var14._M_current;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_238,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar10,(string *)local_238);
            __cxa_throw(prVar10,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if (local_1e8.index_.
            super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr._0_4_ != *(wchar_t *)((long)local_d8 + uVar15 * 4)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x9f);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8," p->rule() == unsigned(masks[index])",0x24);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar16 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar16) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_238._0_8_ = _Var14._M_current;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_238,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar10,(string *)local_238);
            __cxa_throw(prVar10,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        bVar16 = uVar9 < (ulong)((long)local_158.
                                       super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_158.
                                       super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5);
        uVar15 = uVar9;
        uVar9 = (ulong)((int)uVar9 + 1);
      } while (bVar16);
    }
    test_counter = test_counter + 1;
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_228.begin_._M_current = (wchar_t *)0x0;
    local_228.end_._M_current._0_5_ = SUB85(local_1c0,0);
    local_228.end_._M_current._5_3_ = (undefined3)((ulong)local_1c0 >> 0x28);
    local_208 = local_1a0;
    local_204 = (bool)local_19c;
    local_238._0_8_ = local_1b0._M_allocated_capacity;
    local_238._8_8_ = local_1b0._M_allocated_capacity;
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              ((ulong)local_228.index_.
                      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr & 0xffffffff00000000);
    booster::locale::boundary::details::
    segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::increment((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *)local_238);
    if ((CONCAT35(local_1e8.end_._M_current._5_3_,local_1e8.end_._M_current._0_5_) !=
         CONCAT35(local_228.end_._M_current._5_3_,local_228.end_._M_current._0_5_)) ||
       (local_1e8.begin_._M_current != local_228.begin_._M_current)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xa1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," p==map.begin()",0xf);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      iVar6 = error_counter + 1;
      bVar16 = 100000 < error_counter;
      error_counter = iVar6;
      if (bVar16) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_238._0_8_ = _Var14._M_current;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_238,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar10,(string *)local_238);
        __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    local_19c = 0;
    if (local_160._M_current != local_168._M_current) {
      uVar12 = 0;
      uVar15 = 0;
      _Var14._M_current = local_160._M_current;
      do {
        local_1f8._0_8_ =
             (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              *)0x0;
        local_1f8._8_8_ =
             (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              *)0x0;
        local_1e8.index_.
        super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_1e8.begin_._M_current = (wchar_t *)0x0;
        local_1e8.end_._M_current._0_5_ = SUB85(local_1c0,0);
        local_1e8.end_._M_current._5_3_ = (undefined3)((ulong)local_1c0 >> 0x28);
        local_1c8 = local_1a0;
        local_1c4 = (bool)local_19c;
        booster::locale::boundary::details::
        segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::set((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_1f8,(base_iterator)_Var14._M_current);
        uVar2 = local_1e8.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr._0_4_;
        uVar1 = local_1f8._0_8_;
        uVar9 = (long)iStack_90._M_current - (long)local_98 >> 2;
        if (uVar15 < uVar9) {
          uVar15 = (ulong)(((int)uVar15 + 1) -
                          (uint)(uVar12 < *(uint *)((long)local_98 + uVar15 * 4)));
        }
        test_counter = test_counter + 1;
        if (uVar15 < uVar9) {
          local_1f8._0_8_ = &local_1e8;
          std::__cxx11::wstring::
          _M_construct<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
                    ((wstring *)local_1f8,uVar1,local_1f8._8_8_);
          uVar1 = local_1f8._0_8_;
          local_10c = uVar2;
          if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_1f8._8_8_ ==
              (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_158.
                 super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_string_length) {
            if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *)local_1f8._8_8_ ==
                (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *)0x0) {
              bVar16 = true;
            }
            else {
              iVar6 = wmemcmp((wchar_t *)local_1f8._0_8_,
                              local_158.
                              super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_dataplus._M_p,
                              local_1f8._8_8_);
              bVar16 = iVar6 == 0;
            }
          }
          else {
            bVar16 = false;
          }
          if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)uVar1 != &local_1e8) {
            operator_delete((void *)uVar1);
          }
          wVar5 = local_10c;
          if (!bVar16) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Error in line:",0xe);
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xb2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8," p->str()==chunks[chunk_ptr]",0x1c);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            iVar6 = error_counter + 1;
            bVar16 = 100000 < error_counter;
            error_counter = iVar6;
            if (bVar16) {
              prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
              local_1f8._0_8_ = &local_1e8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1f8,"Error limits reached, stopping unit test","");
              booster::runtime_error::runtime_error(prVar10,(string *)local_1f8);
              __cxa_throw(prVar10,&booster::runtime_error::typeinfo,
                          booster::runtime_error::~runtime_error);
            }
          }
          test_counter = test_counter + 1;
          if (wVar5 != *(wchar_t *)((long)local_d8 + uVar15 * 4)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Error in line:",0xe);
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xb3);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8," p->rule()==unsigned(masks[chunk_ptr])",0x26);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            iVar6 = error_counter + 1;
            bVar16 = 100000 < error_counter;
            error_counter = iVar6;
            if (bVar16) {
              prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
              local_1f8._0_8_ = &local_1e8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1f8,"Error limits reached, stopping unit test","");
              booster::runtime_error::runtime_error(prVar10,(string *)local_1f8);
              __cxa_throw(prVar10,&booster::runtime_error::typeinfo,
                          booster::runtime_error::~runtime_error);
            }
          }
        }
        else if (((undefined1 *)
                  CONCAT35(local_1e8.end_._M_current._5_3_,local_1e8.end_._M_current._0_5_) !=
                  local_1c0) ||
                (local_1e8.begin_._M_current !=
                 (wchar_t *)
                 ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_1c0 + 8))->_M_pi
                  - *(long *)local_1c0 >> 4))) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xaf);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," p==map.end()",0xd);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar16 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar16) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_1f8._0_8_ = &local_1e8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1f8,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar10,(string *)local_1f8);
            __cxa_throw(prVar10,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        _Var14._M_current = _Var14._M_current + 1;
        uVar12 = uVar12 + 1;
      } while (_Var14._M_current != local_168._M_current);
    }
    local_19c = 1;
    if (local_160._M_current != local_168._M_current) {
      uVar12 = 0;
      uVar15 = 0;
      _Var14._M_current = local_160._M_current;
      do {
        local_1f8._0_8_ =
             (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              *)0x0;
        local_1f8._8_8_ =
             (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              *)0x0;
        local_1e8.index_.
        super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_1e8.begin_._M_current = (wchar_t *)0x0;
        local_1e8.end_._M_current._0_5_ = SUB85(local_1c0,0);
        local_1e8.end_._M_current._5_3_ = (undefined3)((ulong)local_1c0 >> 0x28);
        local_1c8 = local_1a0;
        local_1c4 = (bool)local_19c;
        booster::locale::boundary::details::
        segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::set((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_1f8,(base_iterator)_Var14._M_current);
        uVar2 = local_1e8.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr._0_4_;
        uVar1 = local_1f8._0_8_;
        uVar9 = (long)iStack_90._M_current - (long)local_98 >> 2;
        if (uVar15 < uVar9) {
          uVar15 = (ulong)(((int)uVar15 + 1) -
                          (uint)(uVar12 < *(uint *)((long)local_98 + uVar15 * 4)));
        }
        test_counter = test_counter + 1;
        if (uVar15 < uVar9) {
          local_1f8._0_8_ = &local_1e8;
          std::__cxx11::wstring::
          _M_construct<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
                    ((wstring *)local_1f8,uVar1,local_1f8._8_8_);
          uVar1 = local_1f8._0_8_;
          local_10c = uVar2;
          if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_1f8._8_8_ ==
              (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_78.
                 super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_string_length) {
            if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *)local_1f8._8_8_ ==
                (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *)0x0) {
              bVar16 = true;
            }
            else {
              iVar6 = wmemcmp((wchar_t *)local_1f8._0_8_,
                              local_78.
                              super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_dataplus._M_p,
                              local_1f8._8_8_);
              bVar16 = iVar6 == 0;
            }
          }
          else {
            bVar16 = false;
          }
          if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)uVar1 != &local_1e8) {
            operator_delete((void *)uVar1);
          }
          wVar5 = local_10c;
          if (!bVar16) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Error in line:",0xe);
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xc5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8," p->str()==fchunks[chunk_ptr]",0x1d);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            iVar6 = error_counter + 1;
            bVar16 = 100000 < error_counter;
            error_counter = iVar6;
            if (bVar16) {
              prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
              local_1f8._0_8_ = &local_1e8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1f8,"Error limits reached, stopping unit test","");
              booster::runtime_error::runtime_error(prVar10,(string *)local_1f8);
              __cxa_throw(prVar10,&booster::runtime_error::typeinfo,
                          booster::runtime_error::~runtime_error);
            }
          }
          test_counter = test_counter + 1;
          if (wVar5 != *(wchar_t *)((long)local_d8 + uVar15 * 4)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Error in line:",0xe);
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xc6);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8," p->rule()==unsigned(masks[chunk_ptr])",0x26);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            iVar6 = error_counter + 1;
            bVar16 = 100000 < error_counter;
            error_counter = iVar6;
            if (bVar16) {
              prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
              local_1f8._0_8_ = &local_1e8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1f8,"Error limits reached, stopping unit test","");
              booster::runtime_error::runtime_error(prVar10,(string *)local_1f8);
              __cxa_throw(prVar10,&booster::runtime_error::typeinfo,
                          booster::runtime_error::~runtime_error);
            }
          }
        }
        else if (((undefined1 *)
                  CONCAT35(local_1e8.end_._M_current._5_3_,local_1e8.end_._M_current._0_5_) !=
                  local_1c0) ||
                (local_1e8.begin_._M_current !=
                 (wchar_t *)
                 ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_1c0 + 8))->_M_pi
                  - *(long *)local_1c0 >> 4))) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xc2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," p==map.end()",0xd);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar16 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar16) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_1f8._0_8_ = &local_1e8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1f8,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar10,(string *)local_1f8);
            __cxa_throw(prVar10,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        _Var14._M_current = _Var14._M_current + 1;
        uVar12 = uVar12 + 1;
      } while (_Var14._M_current != local_168._M_current);
    }
    if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)_Stack_1b8._M_pi !=
        (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1b8._M_pi);
    }
    booster::locale::boundary::details::
    mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::mapping((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_1f8,bt,(base_iterator)local_160._M_current,local_168,local_e8);
    local_1e8.begin_._M_current._0_4_ = local_194;
    local_238._0_8_ =
         CONCAT44(local_1e8.index_.
                  super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr._4_4_,
                  local_1e8.index_.
                  super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr._0_4_);
    local_238._8_8_ = local_238._8_8_ & 0xffffffff00000000;
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_228.begin_._M_current._0_4_ = local_194;
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8;
    if (((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1f8._0_8_ + 8))->_M_pi ==
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_1f8._0_8_) {
      uVar12 = 0;
    }
    else {
      uVar12 = 0;
      do {
        test_counter = test_counter + 1;
        if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_238._0_8_ !=
            *(mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              **)((long)local_108 + (ulong)uVar12 * 8)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xd6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," p->iterator()==iters[i]",0x18)
          ;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar16 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar16) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_1c0 = (undefined1  [8])&local_1b0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1c0,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar10,(string *)local_1c0);
            __cxa_throw(prVar10,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if (local_238._8_4_ !=
            local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar12]) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xd7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," p->rule()==bmasks[i]",0x15);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar16 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar16) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_1c0 = (undefined1  [8])&local_1b0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1c0,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar10,(string *)local_1c0);
            __cxa_throw(prVar10,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        booster::locale::boundary::details::
        boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::increment((boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     *)local_238);
        uVar12 = uVar12 + 1;
      } while (((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *)local_228.index_.
                   super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi !=
                (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *)local_1f8) ||
              ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                *)local_228.index_.
                  super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr !=
               (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                *)((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1f8._0_8_ + 8))->
                         _M_pi - *(long *)local_1f8._0_8_ >> 4)));
    }
    test_counter = test_counter + 1;
    if ((long)iStack_100._M_current - (long)local_108 >> 3 != (ulong)uVar12) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xda);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," iters.size() == i",0x12);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      iVar6 = error_counter + 1;
      bVar16 = 100000 < error_counter;
      error_counter = iVar6;
      if (bVar16) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_1c0 = (undefined1  [8])&local_1b0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c0,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar10,(string *)local_1c0);
        __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    uVar12 = uVar12 - 1;
    do {
      booster::locale::boundary::details::
      boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::decrement((boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)local_238);
      test_counter = test_counter + 1;
      if ((ulong)((long)iStack_100._M_current - (long)local_108 >> 3) <= (ulong)uVar12) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0012136d:
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_1c0 = (undefined1  [8])&local_1b0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c0,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar10,(string *)local_1c0);
        __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
      if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           *)local_238._0_8_ !=
          *(mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            **)((long)local_108 + (ulong)uVar12 * 8)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error in line:",0xe);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xdf);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8," p->iterator()==iters.at(i)",0x1b);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        iVar6 = error_counter + 1;
        bVar16 = 100000 < error_counter;
        error_counter = iVar6;
        if (bVar16) goto LAB_0012136d;
      }
      uVar12 = uVar12 - 1;
    } while (((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_228.index_.
                 super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi !=
              (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_1f8) ||
            ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              *)local_228.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr !=
             (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              *)0x0));
    test_counter = test_counter + 1;
    if (uVar12 != 0xffffffff) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," i==0",5);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      iVar6 = error_counter + 1;
      bVar16 = 100000 < error_counter;
      error_counter = iVar6;
      if (bVar16) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_1c0 = (undefined1  [8])&local_1b0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c0,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar10,(string *)local_1c0);
        __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    if (local_160._M_current != local_168._M_current) {
      uVar15 = 0;
      _Var14._M_current = local_160._M_current;
      do {
        local_1c0 = (undefined1  [8])0x0;
        _Stack_1b8._M_pi = _Stack_1b8._M_pi & 0xffffffff00000000;
        local_1b0._8_8_ = local_1f8;
        local_1a0 = (uint)local_1e8.begin_._M_current;
        booster::locale::boundary::details::
        boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::set((boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_1c0,(base_iterator)_Var14._M_current);
        local_228.begin_._M_current._0_4_ = local_1a0;
        local_228.index_.
        super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)local_1b0._M_allocated_capacity;
        local_228.index_.
        super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._8_8_;
        local_238._0_8_ = local_1c0;
        local_238._8_8_ = _Stack_1b8._M_pi;
        test_counter = test_counter + 1;
        if (local_1c0 !=
            (undefined1  [8])
            *(mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              **)((long)local_108 + uVar15 * 8)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe6);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8," p->iterator()==iters[iters_ptr]",0x20);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar16 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar16) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_1c0 = (undefined1  [8])&local_1b0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1c0,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar10,(string *)local_1c0);
            __cxa_throw(prVar10,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        if ((ulong)((long)iStack_100._M_current - (long)local_108 >> 3) <= uVar15) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar15);
LAB_001213db:
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
          local_238._0_8_ = _Var14._M_current;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_238,"Error limits reached, stopping unit test","");
          booster::runtime_error::runtime_error(prVar10,(string *)local_238);
          __cxa_throw(prVar10,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
        uVar15 = (ulong)((int)uVar15 +
                        (uint)(_Var14._M_current == *(wchar_t **)((long)local_108 + uVar15 * 8)));
        _Var14._M_current = _Var14._M_current + 1;
      } while (_Var14._M_current != local_168._M_current);
    }
    if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)local_1f8._8_8_ !=
        (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_);
    }
    booster::locale::boundary::details::
    mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::mapping((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_1f8,bt,(base_iterator)local_160._M_current,local_168,local_e8);
    local_1e8.begin_._M_current =
         (wchar_t *)
         (CONCAT44((int)((ulong)local_1e8.begin_._M_current >> 0x20),local_194) & 0xffffff00ffffffff
         );
    local_238._0_8_ = local_1f8._0_8_;
    local_238._8_8_ = local_1f8._8_8_;
    if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)local_1f8._8_8_ !=
        (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1f8._8_8_ + 8))->_M_pi =
             *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1f8._8_8_ + 8))->_M_pi +
             1;
        UNLOCK();
      }
      else {
        *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1f8._8_8_ + 8))->_M_pi =
             *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1f8._8_8_ + 8))->_M_pi +
             1;
      }
    }
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              CONCAT44(local_1e8.index_.
                       super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr._4_4_,
                       local_1e8.index_.
                       super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr._0_4_);
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         local_1e8.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    local_228.begin_._M_current._0_4_ = local_194;
    _Stack_1b8._M_pi = _Stack_1b8._M_pi & 0xffffffff00000000;
    local_1b0._M_allocated_capacity = 0;
    local_1a0 = local_194;
    local_1c0 = (undefined1  [8])
                local_228.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
    local_1b0._8_8_ = local_238;
    if (((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1f8._0_8_ + 8))->_M_pi !=
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_1f8._0_8_) {
      uVar15 = 0;
      local_1b0._8_8_ = local_238;
      do {
        test_counter = test_counter + 1;
        if (local_1c0 != (undefined1  [8])*(element_type **)((long)local_108 + uVar15 * 8)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xf9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," p->iterator()==iters[i]",0x18)
          ;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar16 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar16) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_190 = (undefined1  [8])&aStack_180;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_190,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar10,(string *)local_190);
            __cxa_throw(prVar10,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if ((uint)_Stack_1b8._M_pi !=
            local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar15]) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xfa);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," p->rule()==bmasks[i]",0x15);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar16 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar16) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_190 = (undefined1  [8])&aStack_180;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_190,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar10,(string *)local_190);
            __cxa_throw(prVar10,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        booster::locale::boundary::details::
        boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::increment((boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     *)local_1c0);
        uVar15 = (ulong)((int)uVar15 + 1);
      } while (((undefined1 *)local_1b0._8_8_ != local_238) ||
              ((wchar_t *)local_1b0._M_allocated_capacity !=
               (wchar_t *)
               ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_238._0_8_ + 8))->_M_pi -
                *(long *)local_238._0_8_ >> 4)));
    }
    if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)local_238._8_8_ !=
        (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
    }
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_238._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_228.begin_._M_current._0_4_ = local_194;
    local_238._0_8_ = local_1f8._0_8_;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_238 + 8),
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1f8 + 8));
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              CONCAT44(local_1e8.index_.
                       super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr._4_4_,
                       local_1e8.index_.
                       super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr._0_4_);
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         local_1e8.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    _Stack_1b8._M_pi = _Stack_1b8._M_pi & 0xffffffff00000000;
    local_1b0._M_allocated_capacity = 0;
    local_1a0 = (uint)local_228.begin_._M_current;
    local_1c0 = (undefined1  [8])
                local_228.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
    local_1b0._8_8_ = local_238;
    if (((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_238._0_8_ + 8))->_M_pi !=
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_238._0_8_) {
      uVar15 = 0;
      local_1b0._8_8_ = local_238;
      do {
        test_counter = test_counter + 1;
        if (local_1c0 !=
            (undefined1  [8])
            *(mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              **)((long)local_108 + uVar15 * 8)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x104);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," p->iterator()==iters[i]",0x18)
          ;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar16 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar16) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_190 = (undefined1  [8])&aStack_180;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_190,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar10,(string *)local_190);
            __cxa_throw(prVar10,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if ((uint)_Stack_1b8._M_pi !=
            local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar15]) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x105);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," p->rule()==bmasks[i]",0x15);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar16 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar16) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_190 = (undefined1  [8])&aStack_180;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_190,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar10,(string *)local_190);
            __cxa_throw(prVar10,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        booster::locale::boundary::details::
        boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::increment((boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     *)local_1c0);
        uVar15 = (ulong)((int)uVar15 + 1);
      } while (((undefined1 *)local_1b0._8_8_ != local_238) ||
              ((wchar_t *)local_1b0._M_allocated_capacity !=
               (wchar_t *)
               ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_238._0_8_ + 8))->_M_pi -
                *(long *)local_238._0_8_ >> 4)));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
    }
    booster::locale::boundary::details::
    mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::mapping((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_238,bt,(base_iterator)local_160._M_current,local_168,local_e8);
    local_228.begin_._M_current._0_4_ = local_194;
    local_1c0 = (undefined1  [8])local_238._0_8_;
    _Stack_1b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_238._8_8_ + 8) = *(_Atomic_word *)(local_238._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_238._8_8_ + 8) = *(_Atomic_word *)(local_238._8_8_ + 8) + 1;
      }
    }
    local_1b0._M_allocated_capacity =
         (size_type)
         local_228.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    local_1b0._8_8_ =
         local_228.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    local_1a0 = local_194;
    local_190 = (undefined1  [8])
                local_228.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
    local_188._M_pi = local_188._M_pi & 0xffffffff00000000;
    aStack_180._M_allocated_capacity = 0;
    aStack_180._8_8_ = local_1c0;
    local_170 = local_194;
    if (((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_238._0_8_ + 8))->_M_pi !=
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_238._0_8_) {
      uVar15 = 0;
      do {
        test_counter = test_counter + 1;
        if (local_190 !=
            (undefined1  [8])
            *(mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              **)((long)local_108 + uVar15 * 8)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x110);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," p->iterator()==iters[i]",0x18)
          ;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar16 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar16) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_138,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar10,&local_138);
            __cxa_throw(prVar10,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if ((uint)local_188._M_pi !=
            local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar15]) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x111);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," p->rule()==bmasks[i]",0x15);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar16 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar16) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_138,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar10,&local_138);
            __cxa_throw(prVar10,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        booster::locale::boundary::details::
        boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::increment((boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     *)local_190);
        uVar15 = (ulong)((int)uVar15 + 1);
      } while (((mapping_type *)aStack_180._8_8_ != (mapping_type *)local_1c0) ||
              ((wchar_t *)aStack_180._M_allocated_capacity !=
               (wchar_t *)
               ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_1c0 + 8))->_M_pi -
                *(long *)local_1c0 >> 4)));
    }
    if (_Stack_1b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1b8._M_pi);
    }
    local_1b0._8_8_ = (wchar_t *)0x0;
    _Stack_1b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1b0._M_allocated_capacity = 0;
    local_1a0 = 0xffffffff;
    local_1c0 = (undefined1  [8])local_238._0_8_;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&_Stack_1b8,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_238 + 8));
    local_1b0._M_allocated_capacity =
         (size_type)
         local_228.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    local_1b0._8_8_ =
         local_228.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    local_1a0 = (uint)local_228.begin_._M_current;
    local_190 = (undefined1  [8])
                local_228.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
    local_188._M_pi = local_188._M_pi & 0xffffffff00000000;
    aStack_180._M_allocated_capacity = 0;
    aStack_180._8_8_ = local_1c0;
    local_170 = (uint)local_228.begin_._M_current;
    if (((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_1c0 + 8))->_M_pi !=
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_1c0) {
      uVar12 = 0;
      do {
        test_counter = test_counter + 1;
        if (local_190 !=
            (undefined1  [8])
            *(mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              **)((long)local_108 + (ulong)uVar12 * 8)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x11a);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," p->iterator()==iters[i]",0x18)
          ;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar16 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar16) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_138,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar10,&local_138);
            __cxa_throw(prVar10,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if ((uint)local_188._M_pi !=
            local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar12]) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x11b);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," p->rule()==bmasks[i]",0x15);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar16 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar16) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_138,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar10,&local_138);
            __cxa_throw(prVar10,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        booster::locale::boundary::details::
        boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::increment((boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     *)local_190);
        uVar12 = uVar12 + 1;
      } while (((mapping_type *)aStack_180._8_8_ != (mapping_type *)local_1c0) ||
              ((wchar_t *)aStack_180._M_allocated_capacity !=
               (wchar_t *)
               ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_1c0 + 8))->_M_pi -
                *(long *)local_1c0 >> 4)));
    }
    if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)_Stack_1b8._M_pi !=
        (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1b8._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
    }
    if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)local_1f8._8_8_ !=
        (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_);
    }
    booster::locale::boundary::details::
    mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::mapping((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_1c0,bt,(base_iterator)local_160._M_current,local_168,local_e8);
    local_1a0 = 0xffffffff;
    local_190 = local_1c0;
    local_188._M_pi = _Stack_1b8._M_pi;
    if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)_Stack_1b8._M_pi !=
        (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(_Stack_1b8._M_pi)->_M_use_count)->
                 _M_pi =
             *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                      &(_Stack_1b8._M_pi)->_M_use_count)->_M_pi + 1;
        UNLOCK();
      }
      else {
        *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(_Stack_1b8._M_pi)->_M_use_count)->
                 _M_pi =
             *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                      &(_Stack_1b8._M_pi)->_M_use_count)->_M_pi + 1;
      }
    }
    aStack_180._M_allocated_capacity = local_1b0._M_allocated_capacity;
    aStack_180._8_8_ = local_1b0._8_8_;
    local_16c = 0;
    local_170 = local_194;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (wchar_t *)0x0;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1e8.begin_._M_current = (wchar_t *)0x0;
    local_1e8.end_._M_current._0_5_ = 0;
    local_1e8.end_._M_current._5_3_ = 0;
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_228.begin_._M_current = (wchar_t *)0x0;
    local_228.end_._M_current._0_5_ = SUB85(local_190,0);
    local_228.end_._M_current._5_3_ = (undefined3)((ulong)local_190 >> 0x28);
    local_208 = local_194;
    local_204 = false;
    local_238._0_8_ = local_1b0._M_allocated_capacity;
    local_238._8_8_ = local_1b0._M_allocated_capacity;
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              ((ulong)local_228.index_.
                      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr & 0xffffffff00000000);
    booster::locale::boundary::details::
    segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::increment((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *)local_238);
    local_1f8._0_8_ = local_238._0_8_;
    local_1f8._8_8_ = local_238._8_8_;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ =
         local_228.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr._0_4_;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         local_228.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    local_1e8.begin_._M_current = local_228.begin_._M_current;
    local_1c8 = local_208;
    local_1c4 = local_204;
    local_1e8.end_._M_current._0_5_ = local_228.end_._M_current._0_5_;
    local_1e8.end_._M_current._5_3_ = local_228.end_._M_current._5_3_;
    if (((undefined1 *)CONCAT35(local_228.end_._M_current._5_3_,local_228.end_._M_current._0_5_) !=
         local_190) ||
       (local_228.begin_._M_current !=
        (wchar_t *)
        ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_190 + 8))->_M_pi -
         *(long *)local_190 >> 4))) {
      uVar15 = 0;
      do {
        test_counter = test_counter + 1;
        local_238._0_8_ = &local_228;
        std::__cxx11::wstring::
        _M_construct<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
                  ((wstring *)local_238,local_1f8._0_8_,local_1f8._8_8_);
        uVar1 = local_238._0_8_;
        if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_238._8_8_ ==
            (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_158.
               super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_string_length) {
          if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_238._8_8_ ==
              (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)0x0) {
            bVar16 = true;
          }
          else {
            iVar6 = wmemcmp((wchar_t *)local_238._0_8_,
                            local_158.
                            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_dataplus._M_p,
                            local_238._8_8_);
            bVar16 = iVar6 == 0;
          }
        }
        else {
          bVar16 = false;
        }
        if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)uVar1 != &local_228) {
          operator_delete((void *)uVar1);
        }
        if (!bVar16) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x127);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," p->str()==chunks[i]",0x14);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar16 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar16) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_238._0_8_ = &local_228;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_238,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar10,(string *)local_238);
            __cxa_throw(prVar10,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if (local_1e8.index_.
            super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr._0_4_ != *(wchar_t *)((long)local_d8 + uVar15 * 4)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x128);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8," p->rule()==unsigned(masks[i])",0x1e);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar16 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar16) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_238._0_8_ = &local_228;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_238,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar10,(string *)local_238);
            __cxa_throw(prVar10,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        booster::locale::boundary::details::
        segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::increment((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     *)local_1f8);
        uVar15 = (ulong)((int)uVar15 + 1);
      } while (((undefined1 *)
                CONCAT35(local_1e8.end_._M_current._5_3_,local_1e8.end_._M_current._0_5_) !=
                local_190) ||
              (local_1e8.begin_._M_current !=
               (wchar_t *)
               ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_190 + 8))->_M_pi -
                *(long *)local_190 >> 4)));
    }
    if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)local_188._M_pi !=
        (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188._M_pi);
    }
    aStack_180._8_8_ = (mapping_type *)0x0;
    local_188._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    aStack_180._M_allocated_capacity = 0;
    local_16c = 0;
    local_170 = local_194;
    local_190 = local_1c0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&local_188,&_Stack_1b8);
    aStack_180._M_allocated_capacity = local_1b0._M_allocated_capacity;
    aStack_180._8_8_ = local_1b0._8_8_;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (wchar_t *)0x0;
    local_1e8.end_._M_current._0_5_ = 0;
    local_1e8.end_._M_current._5_3_ = 0;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1e8.begin_._M_current = (wchar_t *)0x0;
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_228.begin_._M_current = (wchar_t *)0x0;
    local_228.end_._M_current._0_5_ = SUB85(local_190,0);
    local_228.end_._M_current._5_3_ = (undefined3)((ulong)local_190 >> 0x28);
    local_208 = local_170;
    local_204 = (bool)local_16c;
    local_238._0_8_ = local_1b0._M_allocated_capacity;
    local_238._8_8_ = local_1b0._M_allocated_capacity;
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              ((ulong)local_228.index_.
                      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr & 0xffffffff00000000);
    booster::locale::boundary::details::
    segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::increment((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *)local_238);
    local_1f8._0_8_ = local_238._0_8_;
    local_1f8._8_8_ = local_238._8_8_;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ =
         local_228.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr._0_4_;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         local_228.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    local_1e8.begin_._M_current = local_228.begin_._M_current;
    local_1c8 = local_208;
    local_1c4 = local_204;
    local_1e8.end_._M_current._0_5_ = local_228.end_._M_current._0_5_;
    local_1e8.end_._M_current._5_3_ = local_228.end_._M_current._5_3_;
    if (((undefined1 *)CONCAT35(local_228.end_._M_current._5_3_,local_228.end_._M_current._0_5_) !=
         local_190) ||
       (local_228.begin_._M_current !=
        (wchar_t *)
        ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_190 + 8))->_M_pi -
         *(long *)local_190 >> 4))) {
      uVar15 = 0;
      do {
        test_counter = test_counter + 1;
        local_238._0_8_ = &local_228;
        std::__cxx11::wstring::
        _M_construct<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
                  ((wstring *)local_238,local_1f8._0_8_,local_1f8._8_8_);
        uVar1 = local_238._0_8_;
        if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_238._8_8_ ==
            (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_158.
               super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_string_length) {
          if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_238._8_8_ ==
              (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)0x0) {
            bVar16 = true;
          }
          else {
            iVar6 = wmemcmp((wchar_t *)local_238._0_8_,
                            local_158.
                            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_dataplus._M_p,
                            local_238._8_8_);
            bVar16 = iVar6 == 0;
          }
        }
        else {
          bVar16 = false;
        }
        if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)uVar1 != &local_228) {
          operator_delete((void *)uVar1);
        }
        if (!bVar16) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x132);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," p->str()==chunks[i]",0x14);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar16 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar16) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_238._0_8_ = &local_228;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_238,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar10,(string *)local_238);
            __cxa_throw(prVar10,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if (local_1e8.index_.
            super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr._0_4_ != *(wchar_t *)((long)local_d8 + uVar15 * 4)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x133);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8," p->rule()==unsigned(masks[i])",0x1e);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar16 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar16) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_238._0_8_ = &local_228;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_238,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar10,(string *)local_238);
            __cxa_throw(prVar10,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        booster::locale::boundary::details::
        segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::increment((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     *)local_1f8);
        uVar15 = (ulong)((int)uVar15 + 1);
      } while (((undefined1 *)
                CONCAT35(local_1e8.end_._M_current._5_3_,local_1e8.end_._M_current._0_5_) !=
                local_190) ||
              (local_1e8.begin_._M_current !=
               (wchar_t *)
               ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_190 + 8))->_M_pi -
                *(long *)local_190 >> 4)));
    }
    if (local_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188._M_pi);
    }
    booster::locale::boundary::details::
    mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::mapping((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_190,bt,(base_iterator)local_160._M_current,local_168,local_e8);
    local_16c = 0;
    local_170 = local_194;
    local_138._M_dataplus._M_p = (pointer)local_190;
    local_138._M_string_length = (size_type)local_188._M_pi;
    if (local_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_188._M_pi)->_M_use_count = (local_188._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_188._M_pi)->_M_use_count = (local_188._M_pi)->_M_use_count + 1;
      }
    }
    local_138.field_2._M_allocated_capacity = aStack_180._M_allocated_capacity;
    local_138.field_2._8_8_ = aStack_180._8_8_;
    local_114 = 0;
    local_118 = local_194;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (wchar_t *)0x0;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1e8.begin_._M_current = (wchar_t *)0x0;
    local_1e8.end_._M_current._0_5_ = 0;
    local_1e8.end_._M_current._5_3_ = 0;
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_228.begin_._M_current = (wchar_t *)0x0;
    local_228.end_._M_current._0_5_ = SUB85(&local_138,0);
    local_228.end_._M_current._5_3_ = (undefined3)((ulong)&local_138 >> 0x28);
    local_208 = local_194;
    local_204 = false;
    local_238._0_8_ = aStack_180._M_allocated_capacity;
    local_238._8_8_ = aStack_180._M_allocated_capacity;
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              ((ulong)local_228.index_.
                      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr & 0xffffffff00000000);
    booster::locale::boundary::details::
    segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::increment((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *)local_238);
    local_1f8._0_8_ = local_238._0_8_;
    local_1f8._8_8_ = local_238._8_8_;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ =
         local_228.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr._0_4_;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         local_228.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    local_1e8.begin_._M_current = local_228.begin_._M_current;
    local_1c8 = local_208;
    local_1c4 = local_204;
    local_1e8.end_._M_current._0_5_ = local_228.end_._M_current._0_5_;
    local_1e8.end_._M_current._5_3_ = local_228.end_._M_current._5_3_;
    if (((string *)CONCAT35(local_228.end_._M_current._5_3_,local_228.end_._M_current._0_5_) !=
         &local_138) ||
       (local_228.begin_._M_current !=
        (wchar_t *)
        ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138._M_dataplus._M_p + 8))->
               _M_pi - *(long *)local_138._M_dataplus._M_p >> 4))) {
      uVar15 = 0;
      do {
        test_counter = test_counter + 1;
        local_238._0_8_ = &local_228;
        std::__cxx11::wstring::
        _M_construct<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
                  ((wstring *)local_238,local_1f8._0_8_,local_1f8._8_8_);
        uVar1 = local_238._0_8_;
        if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_238._8_8_ ==
            (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_158.
               super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_string_length) {
          if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_238._8_8_ ==
              (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)0x0) {
            bVar16 = true;
          }
          else {
            iVar6 = wmemcmp((wchar_t *)local_238._0_8_,
                            local_158.
                            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_dataplus._M_p,
                            local_238._8_8_);
            bVar16 = iVar6 == 0;
          }
        }
        else {
          bVar16 = false;
        }
        if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)uVar1 != &local_228) {
          operator_delete((void *)uVar1);
        }
        if (!bVar16) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x13d);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," p->str()==chunks[i]",0x14);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar16 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar16) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_238._0_8_ = &local_228;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_238,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar10,(string *)local_238);
            __cxa_throw(prVar10,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if (local_1e8.index_.
            super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr._0_4_ != *(wchar_t *)((long)local_d8 + uVar15 * 4)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x13e);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8," p->rule()==unsigned(masks[i])",0x1e);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar16 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar16) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_238._0_8_ = &local_228;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_238,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar10,(string *)local_238);
            __cxa_throw(prVar10,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        booster::locale::boundary::details::
        segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::increment((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     *)local_1f8);
        uVar15 = (ulong)((int)uVar15 + 1);
      } while (((string *)CONCAT35(local_1e8.end_._M_current._5_3_,local_1e8.end_._M_current._0_5_)
                != &local_138) ||
              (local_1e8.begin_._M_current !=
               (wchar_t *)
               ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                      (local_138._M_dataplus._M_p + 8))->_M_pi - *(long *)local_138._M_dataplus._M_p
               >> 4)));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length);
    }
    local_138.field_2._8_8_ = 0;
    local_138._M_string_length = 0;
    local_138.field_2._M_allocated_capacity = 0;
    local_118 = 0xffffffff;
    local_114 = 0;
    local_138._M_dataplus._M_p = (pointer)local_190;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_138._M_string_length,&local_188)
    ;
    local_138.field_2._M_allocated_capacity = aStack_180._M_allocated_capacity;
    local_138.field_2._8_8_ = aStack_180._8_8_;
    local_118 = local_170;
    local_114 = local_16c;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (wchar_t *)0x0;
    local_1e8.end_._M_current._0_5_ = 0;
    local_1e8.end_._M_current._5_3_ = 0;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1e8.begin_._M_current = (wchar_t *)0x0;
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_228.begin_._M_current = (wchar_t *)0x0;
    local_228.end_._M_current._0_5_ = SUB85(&local_138,0);
    local_228.end_._M_current._5_3_ = (undefined3)((ulong)&local_138 >> 0x28);
    local_208 = local_170;
    local_204 = (bool)local_16c;
    local_238._0_8_ = aStack_180._M_allocated_capacity;
    local_238._8_8_ = aStack_180._M_allocated_capacity;
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              ((ulong)local_228.index_.
                      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr & 0xffffffff00000000);
    booster::locale::boundary::details::
    segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::increment((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *)local_238);
    local_1f8._0_8_ = local_238._0_8_;
    local_1f8._8_8_ = local_238._8_8_;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ =
         local_228.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr._0_4_;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         local_228.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    local_1e8.begin_._M_current = local_228.begin_._M_current;
    local_1c8 = local_208;
    local_1c4 = local_204;
    local_1e8.end_._M_current._0_5_ = local_228.end_._M_current._0_5_;
    local_1e8.end_._M_current._5_3_ = local_228.end_._M_current._5_3_;
    if (((string *)CONCAT35(local_228.end_._M_current._5_3_,local_228.end_._M_current._0_5_) !=
         &local_138) ||
       (local_228.begin_._M_current !=
        (wchar_t *)
        ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138._M_dataplus._M_p + 8))->
               _M_pi - *(long *)local_138._M_dataplus._M_p >> 4))) {
      uVar15 = 0;
      do {
        test_counter = test_counter + 1;
        local_238._0_8_ = &local_228;
        std::__cxx11::wstring::
        _M_construct<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
                  ((wstring *)local_238,local_1f8._0_8_,local_1f8._8_8_);
        uVar1 = local_238._0_8_;
        if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_238._8_8_ ==
            (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_158.
               super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_string_length) {
          if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_238._8_8_ ==
              (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)0x0) {
            bVar16 = true;
          }
          else {
            iVar6 = wmemcmp((wchar_t *)local_238._0_8_,
                            local_158.
                            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_dataplus._M_p,
                            local_238._8_8_);
            bVar16 = iVar6 == 0;
          }
        }
        else {
          bVar16 = false;
        }
        if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)uVar1 != &local_228) {
          operator_delete((void *)uVar1);
        }
        if (!bVar16) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x147);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," p->str()==chunks[i]",0x14);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar16 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar16) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_238._0_8_ = &local_228;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_238,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar10,(string *)local_238);
            __cxa_throw(prVar10,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if (local_1e8.index_.
            super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr._0_4_ != *(wchar_t *)((long)local_d8 + uVar15 * 4)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x148);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8," p->rule()==unsigned(masks[i])",0x1e);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar16 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar16) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_238._0_8_ = &local_228;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_238,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar10,(string *)local_238);
            __cxa_throw(prVar10,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        booster::locale::boundary::details::
        segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::increment((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     *)local_1f8);
        uVar15 = (ulong)((int)uVar15 + 1);
      } while (((string *)CONCAT35(local_1e8.end_._M_current._5_3_,local_1e8.end_._M_current._0_5_)
                != &local_138) ||
              (local_1e8.begin_._M_current !=
               (wchar_t *)
               ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                      (local_138._M_dataplus._M_p + 8))->_M_pi - *(long *)local_138._M_dataplus._M_p
               >> 4)));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length);
    }
    uVar9 = local_38;
    imasks = local_e0;
    if (local_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188._M_pi);
    }
    if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)_Stack_1b8._M_pi !=
        (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1b8._M_pi);
    }
    if (local_108 != (void *)0x0) {
      operator_delete(local_108);
    }
    std::
    vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::~vector(&local_78);
    std::
    vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::~vector(&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if (local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_98 != (void *)0x0) {
      operator_delete(local_98);
    }
    if (local_d8 != (void *)0x0) {
      operator_delete(local_d8);
    }
    uVar15 = (ulong)((int)uVar9 - 1);
    if ((int)uVar9 < 1) {
      return;
    }
  } while( true );
}

Assistant:

void test_word_container(Iterator begin,Iterator end,
    std::vector<int> const &ipos,
    std::vector<int> const &imasks,
    std::vector<std::basic_string<Char> > const &ichunks,
    std::locale l,
    lb::boundary_type bt=lb::word
    )
{
    for(int sm=(bt == lb::word ? 31 : 3 ) ;sm>=0;sm--) {
        unsigned mask = 
              ((sm & 1 ) != 0) * 0xF
            + ((sm & 2 ) != 0) * 0xF0
            + ((sm & 4 ) != 0) * 0xF00
            + ((sm & 8 ) != 0) * 0xF000
            + ((sm & 16) != 0) * 0xF0000;

        std::vector<int> masks,pos;
        std::vector<unsigned> bmasks;
        std::basic_string<Char> empty_chunk;

        std::vector<std::basic_string<Char> > chunks;
        std::vector<std::basic_string<Char> > fchunks;
        std::vector<Iterator> iters;
        iters.push_back(begin);
        bmasks.push_back(0);

        for(unsigned i=0;i<imasks.size();i++) {
            if(imasks[i] & mask) {
                masks.push_back(imasks[i]);
                chunks.push_back(ichunks[i]);
                fchunks.push_back(empty_chunk + ichunks[i]);
                empty_chunk.clear();
                pos.push_back(ipos[i]);
            }
            else {
                empty_chunk+=ichunks[i];
            }

            if((imasks[i] & mask) || i==imasks.size()-1){
                Iterator ptr=begin;
                std::advance(ptr,ipos[i]);
                iters.push_back(ptr);
                bmasks.push_back(imasks[i]);
            }
        }

        //
        // segment iterator tests
        //
        {
            lb::segment_index<Iterator> map(bt,begin,end,l);
            typedef typename lb::segment_index<Iterator>::iterator iter_type;

            map.rule(mask);

            {        
                unsigned i=0;
                iter_type p;
                map.full_select(false);
                for(p=map.begin();p!=map.end();++p,i++) {
                    TEST(p->str()==chunks[i]);
                    TEST(p->rule() == unsigned(masks[i]));
                }
                
                TEST(chunks.size() == i);
                for(;;) {
                    if(p==map.begin()) {
                        TEST(i==0);
                        break;
                    }
                    else {
                        --p;
                        TEST(p->str()==chunks[--i]);
                        TEST(p->rule() == unsigned(masks[i]));
                    }
                }
                for(i=0,p=map.end();i<chunks.size();i++){
                    --p;
                    unsigned index = chunks.size() - i - 1;
                    TEST(p->str()==chunks[index]);
                    TEST(p->rule() == unsigned(masks[index]));
                }
                TEST(p==map.begin());
            }

            {
                unsigned i=0;
                iter_type p;
                map.full_select(true);
                for(p=map.begin();p!=map.end();++p,i++) {
                    TEST(p->str()==fchunks[i]);
                    TEST(p->rule() == unsigned(masks[i]));
                }

                TEST(chunks.size() == i);
                
                for(;;) {
                    if(p==map.begin()) {
                        TEST(i==0);
                        break;
                    }
                    else {
                        --p;
                        if(p->str()!=fchunks[i-1]) {
                            print_str(p->str());
                            print_str(fchunks[i-1]);
                        }
                        TEST(p->str()==fchunks[--i]);
                        TEST(p->rule() == unsigned(masks[i]));
                    }
                }
                
                for(i=0,p=map.end();i<chunks.size();i++){
                    --p;
                    unsigned index = chunks.size() - i - 1;
                    TEST(p->str()==fchunks[index]);
                    TEST(p->rule() == unsigned(masks[index]));
                }
                TEST(p==map.begin());
            }
            
            {            
                iter_type p;
                unsigned chunk_ptr=0;
                unsigned i=0;
                map.full_select(false);
                for(Iterator optr=begin;optr!=end;optr++,i++) {
                    p=map.find(optr);
                    if(chunk_ptr < pos.size() && i>=unsigned(pos[chunk_ptr])){
                        chunk_ptr++;
                    }
                    if(chunk_ptr>=pos.size()) {
                        TEST(p==map.end());
                    }
                    else {
                        TEST(p->str()==chunks[chunk_ptr]);
                        TEST(p->rule()==unsigned(masks[chunk_ptr]));
                    }
                }
            }
            {            
                iter_type p;
                unsigned chunk_ptr=0;
                unsigned i=0;
                map.full_select(true);
                for(Iterator optr=begin;optr!=end;optr++,i++) {
                    p=map.find(optr);
                    if(chunk_ptr < pos.size() && i>=unsigned(pos[chunk_ptr])){
                        chunk_ptr++;
                    }
                    if(chunk_ptr>=pos.size()) {
                        TEST(p==map.end());
                    }
                    else {
                        TEST(p->str()==fchunks[chunk_ptr]);
                        TEST(p->rule()==unsigned(masks[chunk_ptr]));
                    }
                }
            }

        } // segment iterator tests

        { // break iterator tests
            lb::boundary_point_index<Iterator> map(bt,begin,end,l);
            typedef typename lb::boundary_point_index<Iterator>::iterator iter_type;

            map.rule(mask);
        
            unsigned i=0;
            iter_type p;
            for(p=map.begin();p!=map.end();++p,i++) {
                TEST(p->iterator()==iters[i]);
                TEST(p->rule()==bmasks[i]);
            }

            TEST(iters.size() == i);

            do {
                --p;
                --i;
                TEST(p->iterator()==iters.at(i));
            } while(p!=map.begin());
            TEST(i==0);

            unsigned iters_ptr=0;
            for(Iterator optr=begin;optr!=end;optr++) {
                p=map.find(optr);
                TEST(p->iterator()==iters[iters_ptr]);
                if(iters.at(iters_ptr)==optr)
                    iters_ptr++;
            }
        
        } // break iterator tests

        { // copy test
            typedef lb::segment_index<Iterator> ti_type;
            typedef lb::boundary_point_index<Iterator> bi_type;
            {   // segment to bound
                ti_type ti(bt,begin,end,l);
                ti.rule(mask);
                {
                    bi_type bi(ti);
                    bi.rule(mask);
                    unsigned i=0;
                    typename bi_type::iterator p;
                    for(p=bi.begin();p!=bi.end();++p,i++) {
                        TEST(p->iterator()==iters[i]);
                        TEST(p->rule()==bmasks[i]);
                    }
                }
                {
                    bi_type bi;
                    bi.rule(mask);
                    bi = ti;
                    unsigned i=0;
                    typename bi_type::iterator p;
                    for(p=bi.begin();p!=bi.end();++p,i++) {
                        TEST(p->iterator()==iters[i]);
                        TEST(p->rule()==bmasks[i]);
                    }
                }
                // boundary_point to bound
                bi_type bi_2(bt,begin,end,l);
                bi_2.rule(mask);
                {
                    bi_type bi(bi_2);
                    unsigned i=0;
                    typename bi_type::iterator p;
                    for(p=bi.begin();p!=bi.end();++p,i++) {
                        TEST(p->iterator()==iters[i]);
                        TEST(p->rule()==bmasks[i]);
                    }
                }
                {
                    bi_type bi;
                    bi = bi_2;
                    unsigned i=0;
                    typename bi_type::iterator p;
                    for(p=bi.begin();p!=bi.end();++p,i++) {
                        TEST(p->iterator()==iters[i]);
                        TEST(p->rule()==bmasks[i]);
                    }
                }
            }
            {   // boundary_point to segment
                bi_type bi(bt,begin,end,l);
                {
                    ti_type ti(bi);
                    ti.rule(mask);
                    unsigned i=0;
                    typename ti_type::iterator p;
                    for(p=ti.begin();p!=ti.end();++p,i++) {
                        TEST(p->str()==chunks[i]);
                        TEST(p->rule()==unsigned(masks[i]));
                    }
                }
                {
                    ti_type ti;
                    ti.rule(mask);
                    ti = (bi);
                    unsigned i=0;
                    typename ti_type::iterator p;
                    for(p=ti.begin();p!=ti.end();++p,i++) {
                        TEST(p->str()==chunks[i]);
                        TEST(p->rule()==unsigned(masks[i]));
                    }
                }
                ti_type ti_2(bt,begin,end,l);
                ti_2.rule(mask);
                {
                    ti_type ti(ti_2);
                    unsigned i=0;
                    typename ti_type::iterator p;
                    for(p=ti.begin();p!=ti.end();++p,i++) {
                        TEST(p->str()==chunks[i]);
                        TEST(p->rule()==unsigned(masks[i]));
                    }
                }
                {
                    ti_type ti;
                    ti = (ti_2);
                    unsigned i=0;
                    typename ti_type::iterator p;
                    for(p=ti.begin();p!=ti.end();++p,i++) {
                        TEST(p->str()==chunks[i]);
                        TEST(p->rule()==unsigned(masks[i]));
                    }
                }
            }
        }
    } // for mask

}